

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O3

FileDescriptorProto * __thiscall
google::protobuf::SimpleDescriptorDatabase::
DescriptorIndex<const_google::protobuf::FileDescriptorProto_*>::FindSymbol
          (DescriptorIndex<const_google::protobuf::FileDescriptorProto_*> *this,string *name)

{
  StringPiece sub_symbol;
  StringPiece super_symbol;
  bool bVar1;
  const_iterator cVar2;
  
  cVar2 = (anonymous_namespace)::
          FindLastLessOrEqual<std::map<std::__cxx11::string,google::protobuf::FileDescriptorProto_const*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::FileDescriptorProto_const*>>>,std::__cxx11::string>
                    (&this->by_symbol_,name);
  if ((_Rb_tree_header *)cVar2._M_node != &(this->by_symbol_)._M_t._M_impl.super__Rb_tree_header) {
    sub_symbol = *(StringPiece *)(cVar2._M_node + 1);
    if ((long)cVar2._M_node[1]._M_parent < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                ((size_t)cVar2._M_node[1]._M_parent,"string length exceeds max size");
    }
    super_symbol.ptr_ = (name->_M_dataplus)._M_p;
    super_symbol.length_ = name->_M_string_length;
    if ((long)name->_M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (name->_M_string_length,"string length exceeds max size");
    }
    bVar1 = anon_unknown_31::IsSubSymbol(sub_symbol,super_symbol);
    if (bVar1) {
      return *(FileDescriptorProto **)(cVar2._M_node + 2);
    }
  }
  return (FileDescriptorProto *)0x0;
}

Assistant:

Value SimpleDescriptorDatabase::DescriptorIndex<Value>::FindSymbol(
    const std::string& name) {
  auto iter = FindLastLessOrEqual(&by_symbol_, name);

  return (iter != by_symbol_.end() && IsSubSymbol(iter->first, name))
             ? iter->second
             : Value();
}